

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

string * __thiscall
vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat,
          VkClearValue value)

{
  bool bVar1;
  TextureFormat TVar2;
  string *psVar3;
  undefined8 uVar4;
  ChannelOrder order;
  VkClearColorValue value_00;
  ostringstream stream;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  uVar4 = value._8_8_;
  value_00._0_8_ = value.depthStencil;
  TVar2 = ::vk::mapVkFormat((VkFormat)this);
  order = TVar2.order;
  bVar1 = tcu::hasStencilComponent(order);
  if (!bVar1) {
    bVar1 = tcu::hasDepthComponent(order);
    if (!bVar1) {
      value_00._8_8_ = uVar4;
      psVar3 = clearColorToString_abi_cxx11_
                         (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff)
                          ,vkFormat,value_00);
      return psVar3;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  bVar1 = tcu::hasStencilComponent(order);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"stencil: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  bVar1 = tcu::hasStencilComponent(order);
  if (bVar1) {
    bVar1 = tcu::hasDepthComponent(order);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", ",2);
    }
  }
  bVar1 = tcu::hasDepthComponent(order);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"depth: ",7);
    std::ostream::_M_insert<double>((double)(float)vkFormat);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  psVar3 = (string *)std::ios_base::~ios_base(local_130);
  return psVar3;
}

Assistant:

std::string clearValueToString (VkFormat vkFormat, VkClearValue value)
{
	const tcu::TextureFormat	format	= mapVkFormat(vkFormat);

	if (tcu::hasStencilComponent(format.order) || tcu::hasDepthComponent(format.order))
	{
		std::ostringstream stream;

		stream << "(";

		if (tcu::hasStencilComponent(format.order))
			stream << "stencil: " << value.depthStencil.stencil;

		if (tcu::hasStencilComponent(format.order) && tcu::hasDepthComponent(format.order))
			stream << ", ";

		if (tcu::hasDepthComponent(format.order))
			stream << "depth: " << value.depthStencil.depth;

		stream << ")";

		return stream.str();
	}
	else
		return clearColorToString(vkFormat, value.color);
}